

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFunctionalTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShadersTestGroup::init(ShadersTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  ShadersTestGroup *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"preprocessor",
             "Preprocessor Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"constants",
             "Constant Literal Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"linkage",
             "Linkage Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"conversions",
             "Type Conversion Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"conditionals",
             "Conditionals Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"declarations",
             "Declarations Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"swizzles",
             "Swizzle Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"functions",
             "Function Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"keywords",
             "Keyword Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"reserved_operators",
             "Reserved Operator Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"qualification_order"
             ,"Order of Qualification Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderExecuteTest::ShaderExecuteTest
            ((ShaderExecuteTest *)pTVar1,(this->super_TestCaseGroup).m_context,"scoping",
             "Scoping of Declarations");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderIndexingTests::ShaderIndexingTests
            ((ShaderIndexingTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderLoopTests::ShaderLoopTests((ShaderLoopTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderOperatorTests::ShaderOperatorTests
            ((ShaderOperatorTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderMatrixTests::ShaderMatrixTests
            ((ShaderMatrixTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderReturnTests::ShaderReturnTests
            ((ShaderReturnTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderDiscardTests::ShaderDiscardTests
            ((ShaderDiscardTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderStructTests::ShaderStructTests
            ((ShaderStructTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderBuiltinVarTests::ShaderBuiltinVarTests
            ((ShaderBuiltinVarTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderTextureFunctionTests::ShaderTextureFunctionTests
            ((ShaderTextureFunctionTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderInvarianceTests::ShaderInvarianceTests
            ((ShaderInvarianceTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderFragDataTests::ShaderFragDataTests
            ((ShaderFragDataTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderAlgorithmTests::ShaderAlgorithmTests
            ((ShaderAlgorithmTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderConstExprTests::ShaderConstExprTests
            ((ShaderConstExprTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  RandomShaderTests::RandomShaderTests
            ((RandomShaderTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

virtual void init (void)
	{
		addChild(new ShaderExecuteTest(m_context, "preprocessor",			"Preprocessor Tests"));
		addChild(new ShaderExecuteTest(m_context, "constants",				"Constant Literal Tests"));
		addChild(new ShaderExecuteTest(m_context, "linkage",				"Linkage Tests"));
		addChild(new ShaderExecuteTest(m_context, "conversions",			"Type Conversion Tests"));
		addChild(new ShaderExecuteTest(m_context, "conditionals",			"Conditionals Tests"));
		addChild(new ShaderExecuteTest(m_context, "declarations",			"Declarations Tests"));
		addChild(new ShaderExecuteTest(m_context, "swizzles",				"Swizzle Tests"));
		addChild(new ShaderExecuteTest(m_context, "functions",				"Function Tests"));
		addChild(new ShaderExecuteTest(m_context, "keywords",				"Keyword Tests"));
		addChild(new ShaderExecuteTest(m_context, "reserved_operators",		"Reserved Operator Tests"));
		addChild(new ShaderExecuteTest(m_context, "qualification_order",	"Order of Qualification Tests"));
		addChild(new ShaderExecuteTest(m_context, "scoping",				"Scoping of Declarations"));

		addChild(new ShaderIndexingTests		(m_context));
		addChild(new ShaderLoopTests			(m_context));
		addChild(new ShaderOperatorTests		(m_context));
		addChild(new ShaderMatrixTests			(m_context));
		addChild(new ShaderReturnTests			(m_context));
		addChild(new ShaderDiscardTests			(m_context));
		addChild(new ShaderStructTests			(m_context));
		addChild(new ShaderBuiltinVarTests		(m_context));
		addChild(new ShaderTextureFunctionTests	(m_context));
		addChild(new ShaderInvarianceTests		(m_context));
		addChild(new ShaderFragDataTests		(m_context));
		addChild(new ShaderAlgorithmTests		(m_context));
		addChild(new ShaderConstExprTests		(m_context));

		addChild(new RandomShaderTests(m_context));
	}